

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allmain.c
# Opt level: O2

void nh_lib_init(nh_window_procs *procs,char **paths)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  
  iVar2 = exit_jmp_buf_valid + 1;
  bVar4 = exit_jmp_buf_valid == 0;
  exit_jmp_buf_valid = iVar2;
  if ((bVar4) && (iVar2 = __sigsetjmp(exit_jmp_buf,1), iVar2 != 0)) {
    return;
  }
  memcpy(&windowprocs,procs,0x90);
  for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
    pcVar1 = strdup(paths[lVar3]);
    fqn_prefix[lVar3] = pcVar1;
  }
  u.uhp = 1;
  init_opt_struct();
  turntime = 0;
  lVar3 = get_tz_offset();
  current_timezone = (int)lVar3;
  exit_jmp_buf_valid = exit_jmp_buf_valid + -1;
  return;
}

Assistant:

void nh_lib_init(const struct nh_window_procs *procs, char **paths)
{
    int i;
            
    if (!api_entry_checkpoint()) /* not sure anything in here can actually call panic */
	return;
    
    windowprocs = *procs;
    
    for (i = 0; i < PREFIX_COUNT; i++)
	fqn_prefix[i] = strdup(paths[i]);
    
    u.uhp = 1;	/* prevent RIP on early quits */
    init_opt_struct();
    turntime = 0;
    
    current_timezone = get_tz_offset();
    
    api_exit();
}